

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptArray::SetConfigurable(JavascriptArray *this,PropertyId propertyId,BOOL value)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *pDVar6;
  undefined4 extraout_var;
  uint32 local_2c;
  ScriptContext *pSStack_28;
  uint32 index;
  ScriptContext *scriptContext;
  BOOL value_local;
  PropertyId propertyId_local;
  JavascriptArray *this_local;
  
  scriptContext._0_4_ = value;
  scriptContext._4_4_ = propertyId;
  _value_local = this;
  if (propertyId == 0xd1) {
    if (value != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x3123,"(!value)","!value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this_local._4_4_ = 1;
  }
  else {
    pSStack_28 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    BVar3 = ScriptContext::IsNumericPropertyId(pSStack_28,scriptContext._4_4_,&local_2c);
    if (BVar3 == 0) {
      this_local._4_4_ =
           DynamicObject::SetConfigurable
                     ((DynamicObject *)this,scriptContext._4_4_,(BOOL)scriptContext);
    }
    else {
      pDVar6 = DynamicObject::GetTypeHandler((DynamicObject *)this);
      iVar4 = (*pDVar6->_vptr_DynamicTypeHandler[0x48])(pDVar6,this);
      this_local._4_4_ =
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x158))
                     ((long *)CONCAT44(extraout_var,iVar4),this,scriptContext._4_4_,
                      (BOOL)scriptContext);
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptArray::SetConfigurable(PropertyId propertyId, BOOL value)
    {
        if (propertyId == PropertyIds::length)
        {
            Assert(!value); // Can't change array length configurable
            return true;
        }

        ScriptContext* scriptContext = this->GetScriptContext();

        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return GetTypeHandler()->ConvertToTypeWithItemAttributes(this)
                ->SetConfigurable(this, propertyId, value);
        }

        return __super::SetConfigurable(propertyId, value);
    }